

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int BrotliEncoderCompressStream
              (BrotliEncoderState *s,BrotliEncoderOperation op,size_t *available_in,
              uint8_t **next_in,size_t *available_out,uint8_t **next_out,size_t *total_out)

{
  MemoryManager *pMVar1;
  anon_union_16_2_c961180f_for_tiny_buf_ *__dest;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  BrotliEncoderStreamState BVar6;
  ulong uVar7;
  uint32_t *puVar8;
  uint8_t *puVar9;
  long lVar10;
  uint8_t *puVar11;
  int *table;
  bool bVar12;
  ulong uVar13;
  size_t __n;
  size_t sVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint8_t *puVar18;
  uint uVar19;
  bool bVar21;
  uint32_t *local_a0;
  uint32_t *local_90;
  uint8_t *local_88;
  uint8_t *local_80;
  size_t storage_ix;
  uint local_60;
  BrotliEncoderStreamState local_5c;
  uint8_t *local_58;
  size_t *local_50;
  uint16_t *local_48;
  uint8_t *local_40;
  size_t local_38;
  uint32_t uVar20;
  
  EnsureInitialized(s);
  if ((ulong)s->remaining_metadata_bytes_ != 0xffffffff) {
    if (op != BROTLI_OPERATION_EMIT_METADATA) {
      return 0;
    }
    if (*available_in != (ulong)s->remaining_metadata_bytes_) {
      return 0;
    }
LAB_00105d39:
    if ((s->params).size_hint == 0) {
      uVar7 = s->input_pos_ - s->last_processed_pos_;
      if (0x3fffffff < uVar7) {
        uVar7 = 0x40000000;
      }
      (s->params).size_hint = uVar7;
    }
    if (*available_in < 0x1000001) {
      if (s->stream_state_ == BROTLI_STREAM_PROCESSING) {
        s->remaining_metadata_bytes_ = (uint32_t)*available_in;
        s->stream_state_ = BROTLI_STREAM_METADATA_HEAD;
      }
      else if (1 < s->stream_state_ - BROTLI_STREAM_METADATA_HEAD) {
        return 0;
      }
      __dest = &s->tiny_buf_;
      do {
        while( true ) {
          do {
            iVar4 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
          } while (iVar4 != 0);
          if (s->available_out_ != 0) {
            return 1;
          }
          if (s->input_pos_ != s->last_flush_pos_) break;
          if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD) {
            s->next_out_ = (uint8_t *)__dest;
            uVar5 = s->remaining_metadata_bytes_;
            bVar2 = s->last_bytes_bits_;
            uVar16 = (ulong)bVar2;
            *(uint16_t *)&s->tiny_buf_ = s->last_bytes_;
            s->last_bytes_ = 0;
            s->last_bytes_bits_ = '\0';
            *(ulong *)((long)&s->tiny_buf_ + (ulong)(bVar2 >> 3)) =
                 (ulong)(s->tiny_buf_).u8[bVar2 >> 3];
            uVar13 = uVar16 + 1 >> 3;
            uVar17 = (ulong)(bVar2 + 3 >> 3);
            uVar7 = uVar16 + 4;
            *(ulong *)((long)&s->tiny_buf_ + uVar13) =
                 3L << ((byte)(uVar16 + 1) & 7) | (ulong)(s->tiny_buf_).u8[uVar13];
            *(ulong *)((long)&s->tiny_buf_ + uVar17) = (ulong)(s->tiny_buf_).u8[uVar17];
            if ((ulong)uVar5 == 1) {
              uVar15 = 0;
LAB_00106097:
              uVar13 = uVar16 + (ulong)uVar15 * 8;
              *(ulong *)((long)__dest + (uVar7 >> 3)) =
                   (ulong)uVar15 << ((byte)uVar7 & 7) | (ulong)__dest->u8[uVar7 >> 3];
              uVar7 = uVar16 + 6 >> 3;
              *(ulong *)((long)__dest + uVar7) =
                   (ulong)uVar5 - 1 << ((byte)(uVar16 + 6) & 7) | (ulong)__dest->u8[uVar7];
            }
            else {
              if (uVar5 != 0) {
                uVar15 = 0x1f;
                if (uVar5 - 1 != 0) {
                  for (; uVar5 - 1 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                  }
                }
                uVar15 = (uVar15 ^ 0xffffffe0) + 0x28 >> 3;
                goto LAB_00106097;
              }
              *(ulong *)((long)__dest + (uVar7 >> 3)) = (ulong)__dest->u8[uVar7 >> 3];
              uVar13 = uVar16;
            }
            s->available_out_ = uVar13 + 0xd >> 3;
            s->stream_state_ = BROTLI_STREAM_METADATA_BODY;
          }
          else {
            uVar5 = s->remaining_metadata_bytes_;
            uVar7 = (ulong)uVar5;
            if (uVar7 == 0) {
              s->remaining_metadata_bytes_ = 0xffffffff;
              s->stream_state_ = BROTLI_STREAM_PROCESSING;
              return 1;
            }
            uVar13 = *available_out;
            if (uVar13 == 0) {
              if (0xf < uVar5) {
                uVar5 = 0x10;
              }
              uVar7 = (ulong)uVar5;
              s->next_out_ = (uint8_t *)__dest;
              memcpy(__dest,*next_in,uVar7);
              *next_in = *next_in + uVar7;
              *available_in = *available_in - uVar7;
              s->remaining_metadata_bytes_ = s->remaining_metadata_bytes_ - uVar5;
              s->available_out_ = uVar7;
            }
            else {
              if (uVar7 < uVar13) {
                uVar13 = uVar7;
              }
              memcpy(*next_out,*next_in,uVar13);
              *next_in = *next_in + uVar13;
              *available_in = *available_in - uVar13;
              s->remaining_metadata_bytes_ = s->remaining_metadata_bytes_ - (int)uVar13;
              *next_out = *next_out + uVar13;
              *available_out = *available_out - uVar13;
            }
          }
        }
        iVar4 = EncodeData(s,0,1,&s->available_out_,&s->next_out_);
      } while (iVar4 != 0);
    }
    return 0;
  }
  if (op == BROTLI_OPERATION_EMIT_METADATA) goto LAB_00105d39;
  if (s->stream_state_ - BROTLI_STREAM_METADATA_HEAD < 2) {
    return 0;
  }
  if ((s->stream_state_ != BROTLI_STREAM_PROCESSING) && (*available_in != 0)) {
    return 0;
  }
  uVar5 = (s->params).quality;
  if (1 < uVar5) {
    pMVar1 = &s->memory_manager_;
    while( true ) {
      do {
        while( true ) {
          uVar16 = s->input_pos_ - s->last_processed_pos_;
          EnsureInitialized(s);
          uVar13 = 1L << ((byte)(s->params).lgblock & 0x3f);
          uVar7 = uVar13 - uVar16;
          bVar21 = uVar7 == 0;
          if (uVar13 < uVar16) {
            uVar7 = 0;
          }
          if ((uVar13 < uVar16 || bVar21) || (uVar17 = *available_in, uVar17 == 0)) break;
          if (uVar7 < uVar17) {
            uVar17 = uVar7;
          }
          puVar11 = *next_in;
          EnsureInitialized(s);
          uVar20 = (s->ringbuffer_).pos_;
          uVar5 = (uint)uVar17;
          if ((uVar20 == 0) && (uVar17 < (s->ringbuffer_).tail_size_)) {
            (s->ringbuffer_).pos_ = uVar5;
            puVar9 = (uint8_t *)BrotliAllocate(pMVar1,(ulong)(uVar5 + 2) + 7);
            puVar18 = (s->ringbuffer_).data_;
            if (puVar18 != (uint8_t *)0x0) {
              memcpy(puVar9,puVar18,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7);
              BrotliFree(pMVar1,(s->ringbuffer_).data_);
            }
            (s->ringbuffer_).data_ = puVar9;
            (s->ringbuffer_).cur_size_ = uVar5;
            (s->ringbuffer_).buffer_ = puVar9 + 2;
            puVar9[1] = '\0';
            (s->ringbuffer_).buffer_[-2] = '\0';
            lVar10 = 0;
            do {
              (s->ringbuffer_).buffer_[lVar10 + (ulong)(s->ringbuffer_).cur_size_] = '\0';
              lVar10 = lVar10 + 1;
            } while (lVar10 != 7);
            memcpy((s->ringbuffer_).buffer_,puVar11,uVar17);
            uVar5 = (s->ringbuffer_).pos_;
          }
          else {
            uVar15 = (s->ringbuffer_).total_size_;
            if ((s->ringbuffer_).cur_size_ < uVar15) {
              puVar9 = (uint8_t *)BrotliAllocate(pMVar1,(ulong)(uVar15 + 2) + 7);
              puVar18 = (s->ringbuffer_).data_;
              if (puVar18 != (uint8_t *)0x0) {
                memcpy(puVar9,puVar18,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7);
                BrotliFree(pMVar1,(s->ringbuffer_).data_);
              }
              (s->ringbuffer_).data_ = puVar9;
              (s->ringbuffer_).cur_size_ = uVar15;
              (s->ringbuffer_).buffer_ = puVar9 + 2;
              puVar9[1] = '\0';
              (s->ringbuffer_).buffer_[-2] = '\0';
              lVar10 = 0;
              do {
                (s->ringbuffer_).buffer_[lVar10 + (ulong)(s->ringbuffer_).cur_size_] = '\0';
                lVar10 = lVar10 + 1;
              } while (lVar10 != 7);
              (s->ringbuffer_).buffer_[(s->ringbuffer_).size_ - 2] = '\0';
              (s->ringbuffer_).buffer_[(s->ringbuffer_).size_ - 1] = '\0';
              uVar20 = (s->ringbuffer_).pos_;
            }
            uVar19 = uVar20 & (s->ringbuffer_).mask_;
            uVar7 = (ulong)uVar19;
            uVar15 = (s->ringbuffer_).tail_size_;
            if (uVar19 < uVar15) {
              uVar13 = uVar15 - uVar7;
              if (uVar17 < uVar13) {
                uVar13 = uVar17;
              }
              memcpy((s->ringbuffer_).buffer_ + uVar7 + (s->ringbuffer_).size_,puVar11,uVar13);
            }
            puVar18 = (s->ringbuffer_).buffer_ + uVar7;
            __n = uVar17;
            if ((ulong)(s->ringbuffer_).size_ < uVar7 + uVar17) {
              uVar13 = (s->ringbuffer_).total_size_ - uVar7;
              if (uVar17 < uVar13) {
                uVar13 = uVar17;
              }
              memcpy(puVar18,puVar11,uVar13);
              puVar18 = (s->ringbuffer_).buffer_;
              lVar10 = (s->ringbuffer_).size_ - uVar7;
              puVar11 = puVar11 + lVar10;
              __n = uVar17 - lVar10;
            }
            memcpy(puVar18,puVar11,__n);
            puVar11 = (s->ringbuffer_).buffer_;
            uVar15 = (s->ringbuffer_).pos_;
            puVar11[-2] = puVar11[(s->ringbuffer_).size_ - 2];
            puVar11 = (s->ringbuffer_).buffer_;
            puVar11[-1] = puVar11[(s->ringbuffer_).size_ - 1];
            uVar5 = (uVar5 & 0x7fffffff) + ((s->ringbuffer_).pos_ & 0x7fffffff) |
                    uVar15 & 0x80000000;
            (s->ringbuffer_).pos_ = uVar5;
          }
          s->input_pos_ = s->input_pos_ + uVar17;
          if (uVar5 <= (s->ringbuffer_).mask_) {
            puVar11 = (s->ringbuffer_).buffer_;
            puVar18 = puVar11 + (ulong)uVar5 + 3;
            puVar18[0] = '\0';
            puVar18[1] = '\0';
            puVar18[2] = '\0';
            puVar18[3] = '\0';
            puVar11 = puVar11 + uVar5;
            puVar11[0] = '\0';
            puVar11[1] = '\0';
            puVar11[2] = '\0';
            puVar11[3] = '\0';
          }
          *next_in = *next_in + uVar17;
          *available_in = *available_in - uVar17;
        }
        iVar4 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
      } while (iVar4 != 0);
      if (s->available_out_ != 0) {
        return 1;
      }
      if (s->stream_state_ != BROTLI_STREAM_PROCESSING) break;
      if ((op == BROTLI_OPERATION_PROCESS) && (uVar16 < uVar13)) {
        return 1;
      }
      uVar7 = *available_in;
      bVar21 = uVar7 == 0;
      if ((s->params).size_hint == 0) {
        uVar13 = s->input_pos_ - s->last_processed_pos_;
        sVar14 = uVar13 + uVar7;
        if (0x3fffffff < sVar14) {
          sVar14 = 0x40000000;
        }
        if (0x3fffffff < (uVar13 | uVar7)) {
          sVar14 = 0x40000000;
        }
        (s->params).size_hint = sVar14;
      }
      bVar12 = op == BROTLI_OPERATION_FINISH && bVar21;
      iVar4 = EncodeData(s,(uint)bVar12,(uint)(op == BROTLI_OPERATION_FLUSH && bVar21),
                         &s->available_out_,&s->next_out_);
      if (iVar4 == 0) {
        return 0;
      }
      if (bVar21 && (op == BROTLI_OPERATION_FLUSH || op == BROTLI_OPERATION_FINISH)) {
        s->stream_state_ = bVar12 + BROTLI_STREAM_FLUSH_REQUESTED;
      }
    }
    if (s->stream_state_ != BROTLI_STREAM_FLUSH_REQUESTED) {
      return 1;
    }
    goto LAB_001068a5;
  }
  uVar16 = 1L << ((byte)(s->params).lgwin & 0x3f);
  uVar7 = *available_in;
  uVar13 = uVar16;
  if (uVar7 < uVar16) {
    uVar13 = uVar7;
  }
  sVar14 = 0x20000;
  if (uVar13 < 0x20000) {
    sVar14 = uVar13;
  }
  pMVar1 = &s->memory_manager_;
  if (uVar5 == 1) {
    local_a0 = s->command_buf_;
    if ((local_a0 == (uint32_t *)0x0) && (0x1ffff < uVar13)) {
      puVar8 = (uint32_t *)BrotliAllocate(pMVar1,0x80000);
      s->command_buf_ = puVar8;
      local_80 = (uint8_t *)BrotliAllocate(pMVar1,0x20000);
      s->literal_buf_ = local_80;
      local_a0 = s->command_buf_;
      if (local_a0 == (uint32_t *)0x0) {
LAB_001065c7:
        local_a0 = (uint32_t *)BrotliAllocate(pMVar1,sVar14 * 4);
        local_88 = (uint8_t *)BrotliAllocate(pMVar1,sVar14);
        local_90 = local_a0;
        local_80 = local_88;
        goto LAB_00106600;
      }
    }
    else if (local_a0 == (uint32_t *)0x0) {
      if (uVar7 != 0) goto LAB_001065c7;
      local_80 = (uint8_t *)0x0;
      local_a0 = (uint32_t *)0x0;
    }
    else {
      local_80 = s->literal_buf_;
    }
    local_88 = (uint8_t *)0x0;
    local_90 = (uint32_t *)0x0;
  }
  else {
    local_80 = (uint8_t *)0x0;
    local_88 = (uint8_t *)0x0;
    local_a0 = (uint32_t *)0x0;
    local_90 = (uint32_t *)0x0;
  }
LAB_00106600:
  local_40 = s->cmd_depths_;
  local_48 = s->cmd_bits_;
  local_50 = &s->cmd_code_numbits_;
  local_58 = s->cmd_code_;
  local_60 = op - BROTLI_OPERATION_FLUSH;
  local_5c = (op == BROTLI_OPERATION_FINISH) + BROTLI_STREAM_FLUSH_REQUESTED;
LAB_00106653:
  do {
    iVar4 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
  } while (iVar4 != 0);
  if (((s->available_out_ == 0) && (s->stream_state_ == BROTLI_STREAM_PROCESSING)) &&
     (uVar7 = *available_in, op != BROTLI_OPERATION_PROCESS || uVar7 != 0)) {
    uVar13 = uVar7;
    if (uVar7 > uVar16) {
      uVar13 = uVar16;
    }
    storage_ix = (size_t)s->last_bytes_bits_;
    BVar6 = BROTLI_STREAM_FLUSH_REQUESTED;
    if (op != BROTLI_OPERATION_FLUSH || uVar7 != 0) goto code_r0x001066df;
    goto LAB_00106850;
  }
  BrotliFree(pMVar1,local_90);
  BrotliFree(pMVar1,local_88);
  if (s->stream_state_ != BROTLI_STREAM_FLUSH_REQUESTED) {
    return 1;
  }
  if (s->available_out_ != 0) {
    return 1;
  }
LAB_001068a5:
  s->stream_state_ = BROTLI_STREAM_PROCESSING;
  s->next_out_ = (uint8_t *)0x0;
  return 1;
code_r0x001066df:
  uVar17 = uVar13 * 2 + 0x1f7;
  uVar3 = *available_out;
  if (uVar3 < uVar17) {
    puVar11 = GetBrotliStorage(s,uVar17);
  }
  else {
    puVar11 = *next_out;
  }
  uVar5 = (uint)(op == BROTLI_OPERATION_FINISH && uVar7 <= uVar16);
  *puVar11 = (uint8_t)s->last_bytes_;
  puVar11[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
  table = GetHashTable(s,(s->params).quality,uVar13,&local_38);
  if ((s->params).quality == 0) {
    BrotliCompressFragmentFast
              (pMVar1,*next_in,uVar13,uVar5,table,local_38,local_40,local_48,local_50,local_58,
               &storage_ix,puVar11);
  }
  else {
    BrotliCompressFragmentTwoPass
              (pMVar1,*next_in,uVar13,uVar5,local_a0,local_80,table,local_38,&storage_ix,puVar11);
  }
  *next_in = *next_in + uVar13;
  *available_in = *available_in - uVar13;
  uVar13 = storage_ix >> 3;
  if (uVar3 < uVar17) {
    s->next_out_ = puVar11;
    s->available_out_ = uVar13;
  }
  else {
    *next_out = *next_out + uVar13;
    *available_out = *available_out - uVar13;
    sVar14 = s->total_out_ + uVar13;
    s->total_out_ = sVar14;
    if (total_out != (size_t *)0x0) {
      *total_out = sVar14;
    }
  }
  s->last_bytes_ = (ushort)puVar11[uVar13];
  s->last_bytes_bits_ = (byte)storage_ix & 7;
  BVar6 = local_5c;
  if (local_60 < 2 && uVar7 <= uVar16) {
LAB_00106850:
    s->stream_state_ = BVar6;
  }
  goto LAB_00106653;
}

Assistant:

BROTLI_BOOL BrotliEncoderCompressStream(
    BrotliEncoderState* s, BrotliEncoderOperation op, size_t* available_in,
    const uint8_t** next_in, size_t* available_out,uint8_t** next_out,
    size_t* total_out) {
  if (!EnsureInitialized(s)) return BROTLI_FALSE;

  /* Unfinished metadata block; check requirements. */
  if (s->remaining_metadata_bytes_ != BROTLI_UINT32_MAX) {
    if (*available_in != s->remaining_metadata_bytes_) return BROTLI_FALSE;
    if (op != BROTLI_OPERATION_EMIT_METADATA) return BROTLI_FALSE;
  }

  if (op == BROTLI_OPERATION_EMIT_METADATA) {
    UpdateSizeHint(s, 0);  /* First data metablock might be emitted here. */
    return ProcessMetadata(
        s, available_in, next_in, available_out, next_out, total_out);
  }

  if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD ||
      s->stream_state_ == BROTLI_STREAM_METADATA_BODY) {
    return BROTLI_FALSE;
  }

  if (s->stream_state_ != BROTLI_STREAM_PROCESSING && *available_in != 0) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    return BrotliEncoderCompressStreamFast(s, op, available_in, next_in,
        available_out, next_out, total_out);
  }
  while (BROTLI_TRUE) {
    size_t remaining_block_size = RemainingInputBlockSize(s);

    if (remaining_block_size != 0 && *available_in != 0) {
      size_t copy_input_size =
          BROTLI_MIN(size_t, remaining_block_size, *available_in);
      CopyInputToRingBuffer(s, copy_input_size, *next_in);
      *next_in += copy_input_size;
      *available_in -= copy_input_size;
      continue;
    }

    if (InjectFlushOrPushOutput(s, available_out, next_out, total_out)) {
      continue;
    }

    /* Compress data only when internal output buffer is empty, stream is not
       finished and there is no pending flush request. */
    if (s->available_out_ == 0 &&
        s->stream_state_ == BROTLI_STREAM_PROCESSING) {
      if (remaining_block_size == 0 || op != BROTLI_OPERATION_PROCESS) {
        BROTLI_BOOL is_last = TO_BROTLI_BOOL(
            (*available_in == 0) && op == BROTLI_OPERATION_FINISH);
        BROTLI_BOOL force_flush = TO_BROTLI_BOOL(
            (*available_in == 0) && op == BROTLI_OPERATION_FLUSH);
        BROTLI_BOOL result;
        UpdateSizeHint(s, *available_in);
        result = EncodeData(s, is_last, force_flush,
            &s->available_out_, &s->next_out_);
        if (!result) return BROTLI_FALSE;
        if (force_flush) s->stream_state_ = BROTLI_STREAM_FLUSH_REQUESTED;
        if (is_last) s->stream_state_ = BROTLI_STREAM_FINISHED;
        continue;
      }
    }
    break;
  }
  CheckFlushComplete(s);
  return BROTLI_TRUE;
}